

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall spvtools::opt::analysis::Array::IsSameImpl(Array *this,Type *that,IsSameCache *seen)

{
  pointer __s1;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t __n;
  long lVar4;
  
  iVar3 = (*that->_vptr_Type[0x18])(that);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (((lVar4 != 0) &&
      (iVar3 = (*this->element_type_->_vptr_Type[2])
                         (this->element_type_,*(undefined8 *)(lVar4 + 0x28),seen),
      (char)iVar3 != '\0')) && (bVar2 = Type::HasSameDecorations(&this->super_Type,that), bVar2)) {
    __s1 = (this->length_info_).words.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = (this->length_info_).words.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    if (__n == *(long *)(lVar4 + 0x40) - (long)*(void **)(lVar4 + 0x38)) {
      if (puVar1 != __s1) {
        iVar3 = bcmp(__s1,*(void **)(lVar4 + 0x38),__n);
        return iVar3 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Array::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Array* at = that->AsArray();
  if (!at) return false;
  bool is_same = element_type_->IsSameImpl(at->element_type_, seen);
  is_same = is_same && HasSameDecorations(that);
  is_same = is_same && (length_info_.words == at->length_info_.words);
  return is_same;
}